

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O0

void __thiscall xemmai::t_io::t_io(t_io *this)

{
  t_io *this_local;
  
  t_library::t_library(&this->super_t_library,(t_handle *)0x0);
  (this->super_t_library).super_t_body._vptr_t_body = (_func_int **)&PTR__t_io_002e5b38;
  t_slot::t_slot(&this->v_symbol_close,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_read,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_write,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_flush,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_read_line,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_write_line,(t_object *)0x0);
  t_slot::t_slot(&this->v_symbol_resume,(t_object *)0x0);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::t_slot_of(&this->v_type_file);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::t_slot_of(&this->v_type_reader);
  t_slot_of<xemmai::t_type_of<xemmai::t_object>_>::t_slot_of(&this->v_type_writer);
  return;
}

Assistant:

t_io() : t_library(nullptr)
	{
	}